

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

void __thiscall ev3dev::gyro_sensor::gyro_sensor(gyro_sensor *this,address_type *address)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string *in_RSI;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RDI;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000000f0;
  address_type *in_stack_000000f8;
  sensor *in_stack_00000100;
  string *local_d8;
  allocator_type *__a;
  string *this_00;
  allocator *paVar1;
  undefined4 in_stack_ffffffffffffff50;
  uint uVar2;
  undefined4 in_stack_ffffffffffffff54;
  allocator local_99;
  string *local_98;
  string local_90 [32];
  string *local_70;
  undefined8 local_68;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffff50);
  this_00 = local_90;
  paVar1 = &local_99;
  local_98 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_00,"lego-ev3-gyro",paVar1);
  uVar2 = uVar2 & 0xffffff;
  local_70 = local_90;
  local_68 = 1;
  __a = (allocator_type *)&stack0xffffffffffffff51;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x129952);
  __l._M_len._0_4_ = uVar2;
  __l._M_array = (iterator)paVar1;
  __l._M_len._4_4_ = in_stack_ffffffffffffff54;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)this_00,__l,in_RDI,__a);
  sensor::sensor(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1299a4);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1299ae);
  local_d8 = (string *)&local_70;
  do {
    local_d8 = local_d8 + -0x20;
    std::__cxx11::string::~string(local_d8);
  } while (local_d8 != local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

gyro_sensor::gyro_sensor(address_type address)
    : sensor(address, { ev3_gyro })
{ }